

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

decNumber * uprv_decNumberAnd_63(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set)

{
  uint8_t *uar;
  int32_t iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint uVar4;
  int len;
  uint uVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  ulong uVar8;
  byte bVar9;
  uint8_t *puVar10;
  byte bVar11;
  
  if ((((lhs->exponent == 0) && (lhs->bits < 0x10)) && (rhs->exponent == 0)) && (rhs->bits < 0x10))
  {
    uVar4 = lhs->digits;
    if ((long)(int)uVar4 < 0x32) {
      uVar4 = (uint)""[(int)uVar4];
    }
    uVar5 = rhs->digits;
    if ((long)(int)uVar5 < 0x32) {
      uVar5 = (uint)""[(int)uVar5];
    }
    puVar3 = lhs->lsu;
    puVar2 = rhs->lsu;
    uar = res->lsu;
    uVar8 = (ulong)set->digits;
    if ((long)uVar8 < 0x32) {
      uVar8 = (ulong)""[uVar8];
    }
    puVar6 = puVar3 + ((ulong)uVar4 - 1);
    puVar7 = puVar2 + ((ulong)uVar5 - 1);
    len = 0;
    for (puVar10 = uar; puVar10 <= uar + (uVar8 - 1); puVar10 = puVar10 + 1) {
      if (puVar6 < puVar3) {
        bVar11 = 0;
      }
      else {
        bVar11 = *puVar3;
      }
      if (puVar7 < puVar2) {
        bVar9 = 0;
      }
      else {
        bVar9 = *puVar2;
      }
      *puVar10 = '\0';
      if ((bVar9 != 0 || bVar11 != 0) &&
         (*puVar10 = bVar11 & bVar9 & 1, 1 < (byte)(bVar9 % 10 | bVar11 % 10))) goto LAB_0023b96f;
      puVar3 = puVar3 + 1;
      puVar2 = puVar2 + 1;
      len = len + 1;
    }
    iVar1 = decGetDigits(uar,len);
    res->digits = iVar1;
    res->exponent = 0;
    res->bits = '\0';
  }
  else {
LAB_0023b96f:
    decStatus(res,0x80,set);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberAnd(decNumber *res, const decNumber *lhs,
                         const decNumber *rhs, decContext *set) {
  const Unit *ua, *ub;                  /* -> operands  */
  const Unit *msua, *msub;              /* -> operand msus  */
  Unit *uc,  *msuc;                     /* -> result and its msu  */
  Int   msudigs;                        /* digits in res msu  */
  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  if (lhs->exponent!=0 || decNumberIsSpecial(lhs) || decNumberIsNegative(lhs)
   || rhs->exponent!=0 || decNumberIsSpecial(rhs) || decNumberIsNegative(rhs)) {
    decStatus(res, DEC_Invalid_operation, set);
    return res;
    }

  /* operands are valid  */
  ua=lhs->lsu;                          /* bottom-up  */
  ub=rhs->lsu;                          /* ..  */
  uc=res->lsu;                          /* ..  */
  msua=ua+D2U(lhs->digits)-1;           /* -> msu of lhs  */
  msub=ub+D2U(rhs->digits)-1;           /* -> msu of rhs  */
  msuc=uc+D2U(set->digits)-1;           /* -> msu of result  */
  msudigs=MSUDIGITS(set->digits);       /* [faster than remainder]  */
  for (; uc<=msuc; ua++, ub++, uc++) {  /* Unit loop  */
    Unit a, b;                          /* extract units  */
    if (ua>msua) a=0;
     else a=*ua;
    if (ub>msub) b=0;
     else b=*ub;
    *uc=0;                              /* can now write back  */
    if (a|b) {                          /* maybe 1 bits to examine  */
      Int i, j;
      *uc=0;                            /* can now write back  */
      /* This loop could be unrolled and/or use BIN2BCD tables  */
      for (i=0; i<DECDPUN; i++) {
        if (a&b&1) *uc=*uc+(Unit)powers[i];  /* effect AND  */
        j=a%10;
        a=a/10;
        j|=b%10;
        b=b/10;
        if (j>1) {
          decStatus(res, DEC_Invalid_operation, set);
          return res;
          }
        if (uc==msuc && i==msudigs-1) break; /* just did final digit  */
        } /* each digit  */
      } /* both OK  */
    } /* each unit  */
  /* [here uc-1 is the msu of the result]  */
  res->digits=decGetDigits(res->lsu, static_cast<int32_t>(uc - res->lsu));
  res->exponent=0;                      /* integer  */
  res->bits=0;                          /* sign=0  */
  return res;  /* [no status to set]  */
  }